

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

int nonce_function_test_retry
              (uchar *nonce32,uchar *msg32,uchar *key32,uchar *algo16,void *data,uint counter)

{
  int iVar1;
  undefined4 uVar2;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 auVar3 [16];
  
  if (counter < 3) {
    iVar1 = -(uint)(counter != 0);
    uVar6 = (undefined1)((uint)iVar1 >> 0x18);
    uVar5 = (undefined1)((uint)iVar1 >> 0x10);
    uVar4 = (undefined1)((uint)iVar1 >> 8);
    auVar3._4_4_ = (int)(CONCAT35(CONCAT21(CONCAT11(uVar6,uVar6),uVar5),CONCAT14(uVar5,iVar1)) >>
                        0x20);
    auVar3[3] = uVar4;
    auVar3[2] = uVar4;
    auVar3[0] = (undefined1)iVar1;
    auVar3[1] = auVar3[0];
    auVar3._8_8_ = 0;
    auVar3 = pshuflw(auVar3,auVar3,0);
    uVar2 = auVar3._0_4_;
    *(undefined4 *)(nonce32 + 0x10) = uVar2;
    *(undefined4 *)(nonce32 + 0x14) = uVar2;
    *(undefined4 *)(nonce32 + 0x18) = uVar2;
    *(undefined4 *)(nonce32 + 0x1c) = uVar2;
    *(undefined4 *)nonce32 = uVar2;
    *(undefined4 *)(nonce32 + 4) = uVar2;
    *(undefined4 *)(nonce32 + 8) = uVar2;
    *(undefined4 *)(nonce32 + 0xc) = uVar2;
    iVar1 = 1;
    if (counter == 2) {
      nonce32[0x1f] = 0xfe;
      return 1;
    }
  }
  else if (counter < 5) {
    nonce32[0x10] = 0xba;
    nonce32[0x11] = 0xae;
    nonce32[0x12] = 0xdc;
    nonce32[0x13] = 0xe6;
    nonce32[0x14] = 0xaf;
    nonce32[0x15] = 'H';
    nonce32[0x16] = 0xa0;
    nonce32[0x17] = ';';
    nonce32[0x18] = 0xbf;
    nonce32[0x19] = 0xd2;
    nonce32[0x1a] = '^';
    nonce32[0x1b] = 0x8c;
    nonce32[0x1c] = 0xd0;
    nonce32[0x1d] = '6';
    nonce32[0x1e] = 'A';
    nonce32[0x1f] = 'A';
    nonce32[0] = 0xff;
    nonce32[1] = 0xff;
    nonce32[2] = 0xff;
    nonce32[3] = 0xff;
    nonce32[4] = 0xff;
    nonce32[5] = 0xff;
    nonce32[6] = 0xff;
    nonce32[7] = 0xff;
    nonce32[8] = 0xff;
    nonce32[9] = 0xff;
    nonce32[10] = 0xff;
    nonce32[0xb] = 0xff;
    nonce32[0xc] = 0xff;
    nonce32[0xd] = 0xff;
    nonce32[0xe] = 0xff;
    nonce32[0xf] = 0xfe;
    iVar1 = 1;
    if (counter == 4) {
      nonce32[0x1f] = 'B';
      return 1;
    }
  }
  else {
    iVar1 = 0;
    if (counter == 5) {
      nonce_function_rfc6979(nonce32,msg32,key32,algo16,data,0);
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

static int nonce_function_test_retry(unsigned char *nonce32, const unsigned char *msg32, const unsigned char *key32, const unsigned char *algo16, void *data, unsigned int counter) {
   /* Dummy nonce generator that produces unacceptable nonces for the first several counter values. */
   if (counter < 3) {
       memset(nonce32, counter==0 ? 0 : 255, 32);
       if (counter == 2) {
           nonce32[31]--;
       }
       return 1;
   }
   if (counter < 5) {
       static const unsigned char order[] = {
           0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,
           0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFE,
           0xBA,0xAE,0xDC,0xE6,0xAF,0x48,0xA0,0x3B,
           0xBF,0xD2,0x5E,0x8C,0xD0,0x36,0x41,0x41
       };
       memcpy(nonce32, order, 32);
       if (counter == 4) {
           nonce32[31]++;
       }
       return 1;
   }
   /* Retry rate of 6979 is negligible esp. as we only call this in deterministic tests. */
   /* If someone does fine a case where it retries for secp256k1, we'd like to know. */
   if (counter > 5) {
       return 0;
   }
   return nonce_function_rfc6979(nonce32, msg32, key32, algo16, data, counter - 5);
}